

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O1

int VP8EncAnalyze(VP8Encoder *enc)

{
  size_t __n;
  VP8MBInfo *pVVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  WebPWorkerInterface *pWVar8;
  long lVar9;
  void *ptr;
  int iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int w;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int centers [4];
  int dist_accum [4];
  int accum [4];
  SegmentJob side_job;
  ulong local_2740;
  ulong local_2738;
  uint local_272c [5];
  undefined1 local_2718 [16];
  ulong local_2708;
  VP8Encoder *local_2700;
  size_t local_26f8;
  ulong local_26f0;
  int local_26e8 [4];
  int local_26d8 [6];
  SegmentJob local_26c0;
  SegmentJob local_1378;
  
  if (((enc->config->emulate_jpeg_size == 0) && ((enc->segment_hdr).num_segments < 2)) &&
     (1 < enc->method)) {
    if (0 < enc->mb_h * enc->mb_w) {
      lVar9 = 0;
      do {
        pVVar1 = enc->mb_info;
        *(byte *)(pVVar1 + lVar9) = (*(byte *)(pVVar1 + lVar9) & 0x80) + 1;
        pVVar1[lVar9].alpha = '\0';
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)enc->mb_h * (long)enc->mb_w);
    }
    enc->dqm[0].alpha = 0;
    enc->dqm[0].beta = 0;
    enc->alpha = 0;
    enc->uv_alpha = 0;
    WebPReportProgress(enc->pic,enc->percent + 0x14,&enc->percent);
    iVar7 = 1;
  }
  else {
    iVar7 = enc->mb_h;
    iVar13 = enc->mb_w * iVar7;
    iVar24 = enc->thread_level;
    pWVar8 = WebPGetWorkerInterface();
    if ((iVar24 < 1) || (iVar24 = iVar7 * 9 + 0xf >> 4, iVar24 < 2)) {
      InitSegmentJob(enc,&local_26c0,0,iVar7);
      (*pWVar8->Execute)(&local_26c0.worker);
      uVar25 = (*pWVar8->Sync)(&local_26c0.worker);
      uVar25 = uVar25 & 1;
    }
    else {
      InitSegmentJob(enc,&local_26c0,0,iVar24);
      uVar25 = 0;
      InitSegmentJob(enc,&local_1378,iVar24,iVar7);
      uVar4 = (*pWVar8->Reset)(&local_1378.worker);
      if ((uVar4 & 1) != 0) {
        (*pWVar8->Launch)(&local_1378.worker);
        (*pWVar8->Execute)(&local_26c0.worker);
        uVar25 = (*pWVar8->Sync)(&local_1378.worker);
        uVar4 = (*pWVar8->Sync)(&local_26c0.worker);
        uVar25 = uVar4 & uVar25 & 1;
      }
      (*pWVar8->End)(&local_1378.worker);
      if (uVar25 != 0) {
        lVar9 = 0;
        do {
          iVar7 = local_1378.alphas[lVar9 + 1];
          iVar24 = local_1378.alphas[lVar9 + 2];
          iVar14 = local_1378.alphas[lVar9 + 3];
          iVar20 = local_26c0.alphas[lVar9 + 1];
          iVar10 = local_26c0.alphas[lVar9 + 2];
          iVar5 = local_26c0.alphas[lVar9 + 3];
          local_26c0.alphas[lVar9] = local_26c0.alphas[lVar9] + local_1378.alphas[lVar9];
          local_26c0.alphas[lVar9 + 1] = iVar20 + iVar7;
          local_26c0.alphas[lVar9 + 2] = iVar10 + iVar24;
          local_26c0.alphas[lVar9 + 3] = iVar5 + iVar14;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x100);
        iVar7 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + local_1378.alpha;
        local_26c0.uv_alpha = iVar7 + local_1378.uv_alpha;
      }
    }
    (*pWVar8->End)(&local_26c0.worker);
    if (uVar25 != 0) {
      local_272c[0] = uVar25;
      enc->alpha = local_26c0.alpha / iVar13;
      enc->uv_alpha = local_26c0.uv_alpha / iVar13;
      uVar25 = (enc->segment_hdr).num_segments;
      uVar4 = 4;
      if ((int)uVar25 < 4) {
        uVar4 = uVar25;
      }
      uVar23 = 0;
      do {
        if (local_26c0.alphas[uVar23] != 0) goto LAB_00134b79;
        uVar23 = uVar23 + 1;
      } while (uVar23 != 0x100);
      uVar23 = 0x100;
LAB_00134b79:
      local_2740 = 0xff;
      iVar7 = (int)uVar23;
      local_2708 = uVar23 & 0xffffffff;
      if (iVar7 < 0xff) {
        local_2740 = 0xff;
        do {
          if (local_26c0.alphas[local_2740] != 0) goto LAB_00134bc9;
          local_2740 = local_2740 - 1;
        } while ((uVar23 & 0xffffffff) < local_2740);
        local_2740 = uVar23 & 0xffffffff;
      }
LAB_00134bc9:
      local_2700 = enc;
      iVar24 = (int)local_2740;
      if (0 < (int)uVar25) {
        iVar13 = iVar24 - iVar7;
        lVar9 = (ulong)uVar4 - 1;
        auVar26._8_4_ = (int)lVar9;
        auVar26._0_8_ = lVar9;
        auVar26._12_4_ = (int)((ulong)lVar9 >> 0x20);
        iVar14 = iVar24 * 3 + iVar7 * -3;
        iVar20 = iVar24 * 4 + iVar7 * -4;
        uVar22 = 0;
        auVar26 = auVar26 ^ _DAT_001b3ac0;
        auVar27 = _DAT_001b2890;
        do {
          auVar28 = auVar27 ^ _DAT_001b3ac0;
          if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                      auVar26._4_4_ < auVar28._4_4_) & 1)) {
            *(int *)((long)local_272c + uVar22 + 4) = iVar13 / (int)(uVar4 * 2) + iVar7;
          }
          if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
              auVar28._12_4_ <= auVar26._12_4_) {
            *(int *)((long)local_272c + uVar22 + 8) = iVar14 / (int)(uVar4 * 2) + iVar7;
          }
          lVar9 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar9 + 2;
          uVar22 = uVar22 + 8;
          iVar14 = iVar14 + iVar20;
          iVar13 = iVar13 + iVar20;
        } while ((uVar4 * 4 + 4 & 0x38) != uVar22);
      }
      __n = (ulong)(uVar4 - 1) * 4 + 4;
      local_26f8 = __n;
      if (iVar7 < iVar24) {
        iVar7 = iVar24;
      }
      iVar13 = 0;
      local_26f0 = uVar23;
      do {
        if (0 < (int)uVar25) {
          memset(local_26d8,0,__n);
          memset(local_26e8,0,__n);
          uVar23 = local_26f0;
        }
        if ((int)uVar23 <= iVar24) {
          iVar14 = 0;
          uVar22 = local_2708;
          do {
            iVar20 = local_26c0.alphas[uVar22];
            if (iVar20 != 0) {
              uVar6 = iVar14 + 1U;
              if ((int)(iVar14 + 1U) < (int)uVar4) {
                uVar6 = uVar4;
              }
              iVar10 = iVar14 + -1;
              lVar9 = (long)iVar14;
              do {
                lVar15 = lVar9 + 1;
                iVar5 = (int)uVar22;
                iVar14 = uVar6 - 1;
                if ((int)uVar4 <= lVar15) break;
                uVar17 = iVar5 - local_272c[lVar9 + 2];
                uVar3 = -uVar17;
                if (0 < (int)uVar17) {
                  uVar3 = uVar17;
                }
                uVar18 = iVar5 - local_272c[lVar15];
                uVar17 = -uVar18;
                if (0 < (int)uVar18) {
                  uVar17 = uVar18;
                }
                iVar10 = iVar10 + 1;
                lVar9 = lVar15;
                iVar14 = iVar10;
              } while (uVar3 < uVar17);
              local_26e8[iVar14] = local_26e8[iVar14] + iVar20 * iVar5;
              local_1378.alphas[uVar22 - 0xc] = iVar14;
              local_26d8[iVar14] = local_26d8[iVar14] + iVar20;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != iVar7 + 1);
        }
        if ((int)uVar25 < 1) {
          bVar2 = true;
          uVar22 = 0;
          iVar14 = 0;
        }
        else {
          uVar16 = 0;
          iVar14 = 0;
          iVar20 = 0;
          uVar22 = 0;
          do {
            iVar10 = local_26d8[uVar16];
            if (iVar10 != 0) {
              uVar6 = (iVar10 / 2 + local_26e8[uVar16]) / iVar10;
              iVar12 = local_272c[uVar16 + 1] - uVar6;
              iVar5 = -iVar12;
              if (0 < iVar12) {
                iVar5 = iVar12;
              }
              iVar20 = iVar20 + iVar5;
              local_272c[uVar16 + 1] = uVar6;
              iVar14 = iVar14 + uVar6 * iVar10;
              uVar22 = (ulong)(uint)((int)uVar22 + iVar10);
            }
            uVar16 = uVar16 + 1;
          } while (uVar4 != uVar16);
          bVar2 = iVar20 < 5;
        }
        enc = local_2700;
      } while ((!bVar2) && (iVar13 = iVar13 + 1, iVar13 != 6));
      iVar24 = (iVar14 + ((int)(uVar22 >> 0x1f) + (int)uVar22 >> 1)) / (int)uVar22;
      uVar4 = local_2700->mb_w;
      iVar7 = local_2700->mb_h;
      iVar13 = iVar7 * uVar4;
      if (0 < iVar13) {
        lVar9 = 0;
        do {
          pVVar1 = local_2700->mb_info;
          iVar7 = local_1378.alphas[(ulong)pVVar1[lVar9].alpha - 0xc];
          *(byte *)(pVVar1 + lVar9) = *(byte *)(pVVar1 + lVar9) & 0x9f | ((byte)iVar7 & 3) << 5;
          pVVar1[lVar9].alpha = (uint8_t)local_272c[(long)iVar7 + 1];
          lVar9 = lVar9 + 1;
          uVar4 = local_2700->mb_w;
          iVar7 = local_2700->mb_h;
          iVar13 = iVar7 * uVar4;
        } while (lVar9 < iVar13);
      }
      if (((1 < (int)uVar25) && ((local_2700->config->preprocessing & 1) != 0)) &&
         (ptr = WebPSafeMalloc((long)iVar13,1), ptr != (void *)0x0)) {
        if (2 < iVar7) {
          local_2708 = CONCAT44(local_2708._4_4_,iVar24);
          uVar25 = uVar4 - 1;
          uVar23 = (ulong)uVar4;
          local_2738 = 1;
          do {
            if (2 < (int)uVar4) {
              uVar22 = 1;
              do {
                local_2718 = (undefined1  [16])0x0;
                lVar9 = local_2738 * uVar23 + uVar22;
                pVVar1 = local_2700->mb_info + lVar9;
                bVar11 = *(byte *)pVVar1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar25) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar25) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) + 1;
                bVar11 = bVar11 >> 5 & 3;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) +
                     1;
                lVar15 = 0;
                do {
                  if (4 < *(int *)(local_2718 + lVar15 * 4)) {
                    bVar11 = (byte)lVar15;
                    break;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 4);
                *(byte *)((long)ptr + lVar9) = bVar11;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar25);
            }
            local_2738 = local_2738 + 1;
          } while (local_2738 != iVar7 - 1);
          lVar9 = uVar23 + 1;
          uVar22 = 1;
          do {
            lVar15 = lVar9;
            lVar19 = (ulong)uVar25 - 1;
            if (2 < (int)uVar4) {
              do {
                *(byte *)(local_2700->mb_info + lVar15) =
                     *(byte *)(local_2700->mb_info + lVar15) & 0x9f |
                     (*(byte *)((long)ptr + lVar15) & 3) << 5;
                lVar19 = lVar19 + -1;
                lVar15 = lVar15 + 1;
              } while (lVar19 != 0);
            }
            uVar22 = uVar22 + 1;
            lVar9 = lVar9 + uVar23;
            enc = local_2700;
            iVar24 = (int)local_2708;
          } while (uVar22 != iVar7 - 1);
        }
        WebPSafeFree(ptr);
      }
      iVar7 = (enc->segment_hdr).num_segments;
      lVar9 = (long)iVar7;
      uVar25 = local_272c[1];
      if (1 < lVar9) {
        lVar15 = 0;
        do {
          uVar4 = local_272c[lVar15 + 1];
          if ((int)uVar4 <= (int)local_272c[1]) {
            local_272c[1] = uVar4;
          }
          if ((int)uVar25 <= (int)uVar4) {
            uVar25 = uVar4;
          }
          lVar15 = lVar15 + 1;
        } while (lVar9 != lVar15);
      }
      if (0 < iVar7) {
        uVar4 = local_272c[1] + 1;
        if (uVar25 != local_272c[1]) {
          uVar4 = uVar25;
        }
        piVar21 = &enc->dqm[0].beta;
        lVar15 = 0;
        do {
          iVar7 = (int)((local_272c[lVar15 + 1] - iVar24) * 0xff) / (int)(uVar4 - local_272c[1]);
          iVar13 = (int)((local_272c[lVar15 + 1] - local_272c[1]) * 0xff) /
                   (int)(uVar4 - local_272c[1]);
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          if (iVar7 < -0x7e) {
            iVar7 = -0x7f;
          }
          piVar21[-1] = iVar7;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          *piVar21 = iVar13;
          lVar15 = lVar15 + 1;
          piVar21 = piVar21 + 0xba;
        } while (lVar9 != lVar15);
      }
      if (local_272c[0] != 0) {
        return 1;
      }
    }
    iVar7 = WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return iVar7;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr.num_segments > 1) ||
      (enc->method <= 1);  // for method 0 - 1, we need preds[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h;
    const int total_mb = last_row * enc->mb_w;
#ifdef WEBP_USE_THREAD
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
#ifdef WEBP_USE_THREAD
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
#endif  // WEBP_USE_THREAD
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha = main_job.alpha / total_mb;
      enc->uv_alpha = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  if (!ok) {
    return WebPEncodingSetError(enc->pic,
                                VP8_ENC_ERROR_OUT_OF_MEMORY);  // imprecise
  }
  return ok;
}